

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_server.c
# Opt level: O2

int main(void)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  FILE *pFVar4;
  size_t sVar5;
  char *pcVar6;
  mbedtls_net_context client_fd;
  size_t local_1118;
  mbedtls_net_context listen_fd;
  uchar buf2 [2];
  mbedtls_rsa_context rsa;
  uchar hash [32];
  mbedtls_dhm_context dhm;
  mbedtls_ctr_drbg_context ctr_drbg;
  mbedtls_aes_context aes;
  uchar buf [2048];
  mbedtls_entropy_context entropy;
  
  mbedtls_net_init(&listen_fd);
  mbedtls_net_init(&client_fd);
  mbedtls_rsa_init(&rsa,0,6);
  mbedtls_dhm_init(&dhm);
  mbedtls_aes_init(&aes);
  mbedtls_ctr_drbg_init(&ctr_drbg);
  printf("\n  . Seeding the random number generator");
  fflush(_stdout);
  mbedtls_entropy_init(&entropy);
  uVar1 = mbedtls_ctr_drbg_seed(&ctr_drbg,mbedtls_entropy_func,&entropy,(uchar *)"dh_server",9);
  if (uVar1 == 0) {
    printf("\n  . Reading private key from rsa_priv.txt");
    fflush(_stdout);
    pFVar4 = fopen("rsa_priv.txt","rb");
    if (pFVar4 == (FILE *)0x0) {
      pcVar6 = " failed\n  ! Could not open rsa_priv.txt\n  ! Please run rsa_genkey first\n";
LAB_001075e0:
      puts(pcVar6);
      uVar2 = 1;
      goto LAB_001075e8;
    }
    mbedtls_rsa_init(&rsa,0,0);
    uVar2 = mbedtls_mpi_read_file(&rsa.N,0x10,(FILE *)pFVar4);
    if (uVar2 == 0) {
      uVar2 = mbedtls_mpi_read_file(&rsa.E,0x10,(FILE *)pFVar4);
      if (uVar2 == 0) {
        uVar2 = mbedtls_mpi_read_file(&rsa.D,0x10,(FILE *)pFVar4);
        if (uVar2 == 0) {
          uVar2 = mbedtls_mpi_read_file(&rsa.P,0x10,(FILE *)pFVar4);
          if (uVar2 == 0) {
            uVar2 = mbedtls_mpi_read_file(&rsa.Q,0x10,(FILE *)pFVar4);
            if (uVar2 == 0) {
              uVar2 = mbedtls_mpi_read_file(&rsa.DP,0x10,(FILE *)pFVar4);
              if (uVar2 == 0) {
                uVar2 = mbedtls_mpi_read_file(&rsa.DQ,0x10,(FILE *)pFVar4);
                if (uVar2 == 0) {
                  uVar2 = mbedtls_mpi_read_file(&rsa.QP,0x10,(FILE *)pFVar4);
                  if (uVar2 == 0) {
                    sVar5 = mbedtls_mpi_bitlen(&rsa.N);
                    rsa.len = sVar5 + 7 >> 3;
                    fclose(pFVar4);
                    printf("\n  . Reading DH parameters from dh_prime.txt");
                    fflush(_stdout);
                    pFVar4 = fopen("dh_prime.txt","rb");
                    if (pFVar4 == (FILE *)0x0) {
                      pcVar6 = 
                      " failed\n  ! Could not open dh_prime.txt\n  ! Please run dh_genprime first\n"
                      ;
                      goto LAB_001075e0;
                    }
                    iVar3 = mbedtls_mpi_read_file(&dhm.P,0x10,(FILE *)pFVar4);
                    if (iVar3 == 0) {
                      uVar2 = 0x10;
                      iVar3 = mbedtls_mpi_read_file(&dhm.G,0x10,(FILE *)pFVar4);
                      if (iVar3 == 0) {
                        fclose(pFVar4);
                        printf("\n  . Waiting for a remote connection");
                        fflush(_stdout);
                        uVar1 = mbedtls_net_bind(&listen_fd,(char *)0x0,"11999",0);
                        if (uVar1 == 0) {
                          uVar1 = mbedtls_net_accept(&listen_fd,&client_fd,(void *)0x0,0,
                                                     (size_t *)0x0);
                          if (uVar1 == 0) {
                            printf("\n  . Sending the server\'s DH parameters");
                            fflush(_stdout);
                            memset(buf,0,0x800);
                            sVar5 = mbedtls_mpi_size(&dhm.P);
                            uVar1 = mbedtls_dhm_make_params
                                              (&dhm,(int)sVar5,buf,&local_1118,
                                               mbedtls_ctr_drbg_random,&ctr_drbg);
                            if (uVar1 == 0) {
                              mbedtls_sha1(buf,local_1118,hash);
                              *(ushort *)(buf + local_1118) =
                                   (ushort)rsa.len << 8 | (ushort)rsa.len >> 8;
                              uVar1 = mbedtls_rsa_pkcs1_sign
                                                (&rsa,(_func_int_void_ptr_uchar_ptr_size_t *)0x0,
                                                 (void *)0x0,1,MBEDTLS_MD_SHA256,0,hash,
                                                 buf + local_1118 + 2);
                              if (uVar1 == 0) {
                                sVar5 = local_1118 + rsa.len + 2;
                                buf2 = (uchar  [2])((ushort)sVar5 << 8 | (ushort)sVar5 >> 8);
                                uVar1 = mbedtls_net_send(&client_fd,buf2,2);
                                if (uVar1 == 2) {
                                  uVar1 = mbedtls_net_send(&client_fd,buf,sVar5);
                                  if (uVar1 == (uint)sVar5) {
                                    printf("\n  . Receiving the client\'s public value");
                                    fflush(_stdout);
                                    memset(buf,0,0x800);
                                    uVar1 = mbedtls_net_recv(&client_fd,buf,local_1118);
                                    if (uVar1 == (uint)local_1118) {
                                      uVar1 = mbedtls_dhm_read_public(&dhm,buf,dhm.len);
                                      if (uVar1 == 0) {
                                        printf("\n  . Shared secret: ");
                                        fflush(_stdout);
                                        uVar1 = mbedtls_dhm_calc_secret
                                                          (&dhm,buf,0x800,&local_1118,
                                                           mbedtls_ctr_drbg_random,&ctr_drbg);
                                        if (uVar1 == 0) {
                                          for (local_1118 = 0; local_1118 < 0x10;
                                              local_1118 = local_1118 + 1) {
                                            printf("%02x",(ulong)buf[local_1118]);
                                          }
                                          printf("...\n  . Encrypting and sending the ciphertext");
                                          fflush(_stdout);
                                          mbedtls_aes_setkey_enc(&aes,buf,0x100);
                                          builtin_memcpy(buf,"==Hello there!==",0x10);
                                          mbedtls_aes_crypt_ecb(&aes,1,buf,buf);
                                          uVar1 = mbedtls_net_send(&client_fd,buf,0x10);
                                          if (uVar1 == 0x10) {
                                            puts(anon_var_dwarf_10a1d + 8);
                                            goto LAB_001075e8;
                                          }
                                          pcVar6 = " failed\n  ! mbedtls_net_send returned %d\n\n";
                                        }
                                        else {
                                          pcVar6 = 
                                          " failed\n  ! mbedtls_dhm_calc_secret returned %d\n\n";
                                        }
                                      }
                                      else {
                                        pcVar6 = 
                                        " failed\n  ! mbedtls_dhm_read_public returned %d\n\n";
                                      }
                                    }
                                    else {
                                      pcVar6 = " failed\n  ! mbedtls_net_recv returned %d\n\n";
                                    }
                                    goto LAB_00107835;
                                  }
                                }
                                pcVar6 = " failed\n  ! mbedtls_net_send returned %d\n\n";
                                goto LAB_001074b0;
                              }
                              pcVar6 = " failed\n  ! mbedtls_rsa_pkcs1_sign returned %d\n\n";
                            }
                            else {
                              pcVar6 = " failed\n  ! mbedtls_dhm_make_params returned %d\n\n";
                            }
                          }
                          else {
                            pcVar6 = " failed\n  ! mbedtls_net_accept returned %d\n\n";
                          }
                        }
                        else {
                          pcVar6 = " failed\n  ! mbedtls_net_bind returned %d\n\n";
                        }
LAB_00107835:
                        printf(pcVar6,(ulong)uVar1);
                        uVar2 = uVar1;
                        goto LAB_001075e8;
                      }
                    }
                    puts(" failed\n  ! Invalid DH parameter file\n");
                    fclose(pFVar4);
                    uVar2 = 0;
                    goto LAB_001075e8;
                  }
                }
              }
            }
          }
        }
      }
    }
    printf(" failed\n  ! mbedtls_mpi_read_file returned %d\n\n",(ulong)uVar2);
    fclose(pFVar4);
  }
  else {
    pcVar6 = " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n";
LAB_001074b0:
    printf(pcVar6,(ulong)uVar1);
    uVar2 = uVar1;
  }
LAB_001075e8:
  mbedtls_net_free(&client_fd);
  mbedtls_net_free(&listen_fd);
  mbedtls_aes_free(&aes);
  mbedtls_rsa_free(&rsa);
  mbedtls_dhm_free(&dhm);
  mbedtls_ctr_drbg_free(&ctr_drbg);
  mbedtls_entropy_free(&entropy);
  return uVar2;
}

Assistant:

int main( void )
{
    FILE *f;

    int ret;
    size_t n, buflen;
    mbedtls_net_context listen_fd, client_fd;

    unsigned char buf[2048];
    unsigned char hash[32];
    unsigned char buf2[2];
    const char *pers = "dh_server";

    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    mbedtls_rsa_context rsa;
    mbedtls_dhm_context dhm;
    mbedtls_aes_context aes;

    mbedtls_net_init( &listen_fd );
    mbedtls_net_init( &client_fd );
    mbedtls_rsa_init( &rsa, MBEDTLS_RSA_PKCS_V15, MBEDTLS_MD_SHA256 );
    mbedtls_dhm_init( &dhm );
    mbedtls_aes_init( &aes );
    mbedtls_ctr_drbg_init( &ctr_drbg );

    /*
     * 1. Setup the RNG
     */
    mbedtls_printf( "\n  . Seeding the random number generator" );
    fflush( stdout );

    mbedtls_entropy_init( &entropy );
    if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy,
                               (const unsigned char *) pers,
                               strlen( pers ) ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n", ret );
        goto exit;
    }

    /*
     * 2a. Read the server's private RSA key
     */
    mbedtls_printf( "\n  . Reading private key from rsa_priv.txt" );
    fflush( stdout );

    if( ( f = fopen( "rsa_priv.txt", "rb" ) ) == NULL )
    {
        ret = 1;
        mbedtls_printf( " failed\n  ! Could not open rsa_priv.txt\n" \
                "  ! Please run rsa_genkey first\n\n" );
        goto exit;
    }

    mbedtls_rsa_init( &rsa, MBEDTLS_RSA_PKCS_V15, 0 );

    if( ( ret = mbedtls_mpi_read_file( &rsa.N , 16, f ) ) != 0 ||
        ( ret = mbedtls_mpi_read_file( &rsa.E , 16, f ) ) != 0 ||
        ( ret = mbedtls_mpi_read_file( &rsa.D , 16, f ) ) != 0 ||
        ( ret = mbedtls_mpi_read_file( &rsa.P , 16, f ) ) != 0 ||
        ( ret = mbedtls_mpi_read_file( &rsa.Q , 16, f ) ) != 0 ||
        ( ret = mbedtls_mpi_read_file( &rsa.DP, 16, f ) ) != 0 ||
        ( ret = mbedtls_mpi_read_file( &rsa.DQ, 16, f ) ) != 0 ||
        ( ret = mbedtls_mpi_read_file( &rsa.QP, 16, f ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_read_file returned %d\n\n", ret );
        fclose( f );
        goto exit;
    }

    rsa.len = ( mbedtls_mpi_bitlen( &rsa.N ) + 7 ) >> 3;

    fclose( f );

    /*
     * 2b. Get the DHM modulus and generator
     */
    mbedtls_printf( "\n  . Reading DH parameters from dh_prime.txt" );
    fflush( stdout );

    if( ( f = fopen( "dh_prime.txt", "rb" ) ) == NULL )
    {
        ret = 1;
        mbedtls_printf( " failed\n  ! Could not open dh_prime.txt\n" \
                "  ! Please run dh_genprime first\n\n" );
        goto exit;
    }

    if( mbedtls_mpi_read_file( &dhm.P, 16, f ) != 0 ||
        mbedtls_mpi_read_file( &dhm.G, 16, f ) != 0 )
    {
        mbedtls_printf( " failed\n  ! Invalid DH parameter file\n\n" );
        fclose( f );
        goto exit;
    }

    fclose( f );

    /*
     * 3. Wait for a client to connect
     */
    mbedtls_printf( "\n  . Waiting for a remote connection" );
    fflush( stdout );

    if( ( ret = mbedtls_net_bind( &listen_fd, NULL, SERVER_PORT, MBEDTLS_NET_PROTO_TCP ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_net_bind returned %d\n\n", ret );
        goto exit;
    }

    if( ( ret = mbedtls_net_accept( &listen_fd, &client_fd,
                                    NULL, 0, NULL ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_net_accept returned %d\n\n", ret );
        goto exit;
    }

    /*
     * 4. Setup the DH parameters (P,G,Ys)
     */
    mbedtls_printf( "\n  . Sending the server's DH parameters" );
    fflush( stdout );

    memset( buf, 0, sizeof( buf ) );

    if( ( ret = mbedtls_dhm_make_params( &dhm, (int) mbedtls_mpi_size( &dhm.P ), buf, &n,
                                 mbedtls_ctr_drbg_random, &ctr_drbg ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_dhm_make_params returned %d\n\n", ret );
        goto exit;
    }

    /*
     * 5. Sign the parameters and send them
     */
    mbedtls_sha1( buf, n, hash );

    buf[n    ] = (unsigned char)( rsa.len >> 8 );
    buf[n + 1] = (unsigned char)( rsa.len      );

    if( ( ret = mbedtls_rsa_pkcs1_sign( &rsa, NULL, NULL, MBEDTLS_RSA_PRIVATE, MBEDTLS_MD_SHA256,
                                0, hash, buf + n + 2 ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_rsa_pkcs1_sign returned %d\n\n", ret );
        goto exit;
    }

    buflen = n + 2 + rsa.len;
    buf2[0] = (unsigned char)( buflen >> 8 );
    buf2[1] = (unsigned char)( buflen      );

    if( ( ret = mbedtls_net_send( &client_fd, buf2, 2 ) ) != 2 ||
        ( ret = mbedtls_net_send( &client_fd, buf, buflen ) ) != (int) buflen )
    {
        mbedtls_printf( " failed\n  ! mbedtls_net_send returned %d\n\n", ret );
        goto exit;
    }

    /*
     * 6. Get the client's public value: Yc = G ^ Xc mod P
     */
    mbedtls_printf( "\n  . Receiving the client's public value" );
    fflush( stdout );

    memset( buf, 0, sizeof( buf ) );

    if( ( ret = mbedtls_net_recv( &client_fd, buf, n ) ) != (int) n )
    {
        mbedtls_printf( " failed\n  ! mbedtls_net_recv returned %d\n\n", ret );
        goto exit;
    }

    if( ( ret = mbedtls_dhm_read_public( &dhm, buf, dhm.len ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_dhm_read_public returned %d\n\n", ret );
        goto exit;
    }

    /*
     * 7. Derive the shared secret: K = Ys ^ Xc mod P
     */
    mbedtls_printf( "\n  . Shared secret: " );
    fflush( stdout );

    if( ( ret = mbedtls_dhm_calc_secret( &dhm, buf, sizeof( buf ), &n,
                                 mbedtls_ctr_drbg_random, &ctr_drbg ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_dhm_calc_secret returned %d\n\n", ret );
        goto exit;
    }

    for( n = 0; n < 16; n++ )
        mbedtls_printf( "%02x", buf[n] );

    /*
     * 8. Setup the AES-256 encryption key
     *
     * This is an overly simplified example; best practice is
     * to hash the shared secret with a random value to derive
     * the keying material for the encryption/decryption keys
     * and MACs.
     */
    mbedtls_printf( "...\n  . Encrypting and sending the ciphertext" );
    fflush( stdout );

    mbedtls_aes_setkey_enc( &aes, buf, 256 );
    memcpy( buf, PLAINTEXT, 16 );
    mbedtls_aes_crypt_ecb( &aes, MBEDTLS_AES_ENCRYPT, buf, buf );

    if( ( ret = mbedtls_net_send( &client_fd, buf, 16 ) ) != 16 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_net_send returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( "\n\n" );

exit:

    mbedtls_net_free( &client_fd );
    mbedtls_net_free( &listen_fd );

    mbedtls_aes_free( &aes );
    mbedtls_rsa_free( &rsa );
    mbedtls_dhm_free( &dhm );
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( ret );
}